

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_chk2cmp2_16_ix(void)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar7 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar7);
  }
  uVar2 = m68k_read_memory_16(uVar7 & m68ki_cpu.address_mask);
  uVar1 = *(ushort *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 10 & 0x3c));
  uVar3 = m68ki_get_ea_ix(m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8]);
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar7 = uVar3;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar3);
  }
  uVar4 = m68k_read_memory_16(uVar7 & m68ki_cpu.address_mask);
  uVar4 = (uint)(short)uVar4;
  uVar3 = uVar3 + 2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  uVar5 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
  uVar6 = (int)(short)uVar1;
  if ((short)uVar2 < 0) {
    uVar6 = (uint)uVar1;
  }
  uVar5 = (uint)(short)uVar5;
  m68ki_cpu.not_z_flag = (uint)(uVar4 != uVar6 && uVar5 != uVar6);
  m68ki_cpu.c_flag =
       (uint)(((int)uVar5 < (int)uVar6 || (int)uVar5 < (int)uVar4) || (int)uVar6 < (int)uVar4) << 8;
  if (((uVar2 >> 0xb & 1) != 0) &&
     (((int)uVar5 < (int)uVar6 || (int)uVar5 < (int)uVar4) || (int)uVar6 < (int)uVar4)) {
    m68ki_exception_trap(6);
    return;
  }
  return;
}

Assistant:

static void m68k_op_chk2cmp2_16_ix(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint compare = REG_DA[(word2 >> 12) & 15]&0xffff;
		uint ea = EA_AY_IX_16();
		sint lower_bound = (int16)m68ki_read_16(ea);
		sint upper_bound = (int16)m68ki_read_16(ea + 2);

		if(!BIT_F(word2))
			compare = (int32)(int16)compare;
 		FLAG_Z = !((upper_bound==compare) || (lower_bound==compare));  // JFF: | => ||

        FLAG_C = (lower_bound <= upper_bound ? compare < lower_bound || compare > upper_bound : compare > upper_bound || compare < lower_bound) << 8;

		if(COND_CS() && BIT_B(word2))
				m68ki_exception_trap(EXCEPTION_CHK);
		return;
	}
	m68ki_exception_illegal();
}